

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O3

void boost::throw_exception<boost::bad_lexical_cast>(bad_lexical_cast *e)

{
  clone_impl<boost::exception_detail::error_info_injector<boost::bad_lexical_cast>_> *this;
  undefined **local_58;
  type_info *local_50;
  type_info *ptStack_48;
  undefined **local_40;
  refcount_ptr<boost::exception_detail::error_info_container> local_38;
  char *pcStack_30;
  char *local_28;
  int local_20;
  
  this = (clone_impl<boost::exception_detail::error_info_injector<boost::bad_lexical_cast>_> *)
         __cxa_allocate_exception(0x48);
  local_50 = e->source;
  ptStack_48 = e->target;
  local_38.px_ = (error_info_container *)0x0;
  pcStack_30 = (char *)0x0;
  local_28 = (char *)0x0;
  local_20 = -1;
  local_58 = &PTR__error_info_injector_001cccd8;
  local_40 = &PTR__error_info_injector_001ccd00;
  exception_detail::
  clone_impl<boost::exception_detail::error_info_injector<boost::bad_lexical_cast>_>::clone_impl
            (this,(error_info_injector<boost::bad_lexical_cast> *)&local_58);
  __cxa_throw(this,&exception_detail::
                    clone_impl<boost::exception_detail::error_info_injector<boost::bad_lexical_cast>>
                    ::typeinfo,
              exception_detail::
              clone_impl<boost::exception_detail::error_info_injector<boost::bad_lexical_cast>_>::
              ~clone_impl);
}

Assistant:

BOOST_NORETURN inline void throw_exception( E const & e )
{
    //All boost exceptions are required to derive from std::exception,
    //to ensure compatibility with BOOST_NO_EXCEPTIONS.
    throw_exception_assert_compatibility(e);

#ifndef BOOST_EXCEPTION_DISABLE
    throw enable_current_exception(enable_error_info(e));
#else
    throw e;
#endif
}